

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O0

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalDetach,duckdb::unique_ptr<duckdb::DetachInfo,std::default_delete<duckdb::DetachInfo>,true>,unsigned_long&>
          (PhysicalPlan *this,
          unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true> *args,
          unsigned_long *args_1)

{
  PhysicalOperator *pPVar1;
  ArenaAllocator *in_RDI;
  PhysicalDetach *ptr;
  data_ptr_t mem;
  unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>
  *in_stack_ffffffffffffff98;
  PhysicalDetach *__uref;
  
  pPVar1 = (PhysicalOperator *)
           ArenaAllocator::AllocateAligned(in_RDI,(idx_t)in_stack_ffffffffffffff98);
  unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>::unique_ptr
            ((unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true> *)in_RDI
             ,in_stack_ffffffffffffff98);
  PhysicalDetach::PhysicalDetach
            ((PhysicalDetach *)args_1,
             (unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true> *)mem,
             (idx_t)ptr);
  unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>::~unique_ptr
            ((unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true> *)
             0x7746bd);
  __uref = (PhysicalDetach *)(in_RDI + 1);
  ::std::reference_wrapper<duckdb::PhysicalOperator>::
  reference_wrapper<duckdb::PhysicalDetach&,void,duckdb::PhysicalOperator*>
            ((reference_wrapper<duckdb::PhysicalOperator> *)in_RDI,__uref);
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ::push_back((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               *)in_RDI,(value_type *)__uref);
  return pPVar1;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}